

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_sound_thumbnail.cxx
# Opt level: O1

void __thiscall xray_re::xr_sound_thumbnail::save(xr_sound_thumbnail *this,xr_writer *w)

{
  float local_1c;
  
  xr_writer::w_raw_chunk(w,0x810,&THM_VERSION_SOUNDPARAM,2,false);
  local_1c = 2.8026e-45;
  xr_writer::w_raw_chunk(w,0x813,&local_1c,4,false);
  xr_writer::open_chunk(w,0x1000);
  local_1c = this->quality;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->min_dist;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->max_dist;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)this->game_type;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1001);
  local_1c = this->base_volume;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1002);
  local_1c = this->max_ai_dist;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_sound_thumbnail::save(xr_writer& w) const
{
	w.w_chunk<uint16_t>(THM_CHUNK_VERSION, THM_VERSION_SOUNDPARAM);
	w.w_chunk<uint32_t>(THM_CHUNK_TYPE, THM_TYPE_SOUND);

	w.open_chunk(THM_CHUNK_SOUNDPARAM);
	w.w_float(quality);
	w.w_float(min_dist);
	w.w_float(max_dist);
	w.w_u32(game_type);
	w.close_chunk();

	w.open_chunk(THM_CHUNK_SOUNDPARAM_VOLUME);
	w.w_float(base_volume);
	w.close_chunk();

	w.open_chunk(THM_CHUNK_SOUNDPARAM_AI);
	w.w_float(max_ai_dist);
	w.close_chunk();
}